

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu_common.c
# Opt level: O3

RK_S32 check_stride_by_pixel(RK_S32 workaround,RK_S32 width,RK_S32 hor_stride,RK_S32 pixel_size)

{
  if (workaround != 0) {
    return workaround;
  }
  if (hor_stride < pixel_size * width) {
    _mpp_log_l(4,"vepu_common",
               "warning: stride by bytes %d is smarller than width %d mutiple by pixel size %d\n",
               (char *)0x0,(ulong)(uint)hor_stride,(ulong)(uint)width,pixel_size);
    _mpp_log_l(4,"vepu_common","multiple stride %d by pixel size %d and set new byte stride to %d\n"
               ,(char *)0x0,(ulong)(uint)hor_stride,(ulong)(uint)pixel_size,pixel_size * hor_stride)
    ;
  }
  return (uint)(hor_stride < pixel_size * width);
}

Assistant:

static RK_S32 check_stride_by_pixel(RK_S32 workaround, RK_S32 width,
                                    RK_S32 hor_stride, RK_S32 pixel_size)
{
    if (!workaround && hor_stride < width * pixel_size) {
        mpp_log("warning: stride by bytes %d is smarller than width %d mutiple by pixel size %d\n",
                hor_stride, width, pixel_size);
        mpp_log("multiple stride %d by pixel size %d and set new byte stride to %d\n",
                hor_stride, pixel_size, hor_stride * pixel_size);
        workaround = 1;
    }

    return workaround;
}